

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O3

void __thiscall RhombicLattice::createUpEdgesMap(RhombicLattice *this)

{
  int iVar1;
  uint uVar2;
  iterator iVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  vector<int,_std::allocator<int>_> *pvVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cartesian4 cVar8;
  vvint vertexToUpEdges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directionList;
  int local_18c;
  Lattice *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_178;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  long *local_78 [2];
  long local_68 [2];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"xy","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"xz","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"yz","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-xyz","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xy","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"-xz","");
  plVar4 = local_68;
  local_78[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-yz","");
  __l._M_len = 8;
  __l._M_array = (iterator)local_158;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_178);
  lVar6 = -0x100;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  local_50 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
                *)&(this->super_Lattice).upEdgesMap;
    __x = local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_188 = &this->super_Lattice;
    do {
      local_178.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar1 = (this->super_Lattice).l;
      local_158._16_8_ = 0;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::_M_fill_assign(&local_178,(long)(iVar1 * iVar1 * iVar1 * 2),(value_type *)local_158);
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
      }
      iVar1 = (this->super_Lattice).l;
      if (0 < iVar1 * iVar1 * iVar1 * 2) {
        uVar5 = 0;
        local_180 = __x;
        do {
          cVar8 = Lattice::indexToCoordinate(&this->super_Lattice,(int)uVar5);
          uVar2 = cVar8.y + cVar8.x + cVar8.z & 0x80000001;
          if (cVar8._8_8_ >> 0x20 == 0) {
            if (uVar2 == 1) {
              iVar1 = std::__cxx11::string::compare((char *)__x);
              if (iVar1 == 0) {
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                __x = local_180;
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,1);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                }
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,1);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                }
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,1);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                }
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,1);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
LAB_0012cbf6:
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)__x);
                if (iVar1 == 0) {
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                  this = (RhombicLattice *)local_188;
                  local_18c = (*local_188->_vptr_Lattice[2])
                                        (local_188,uVar5 & 0xffffffff,(string *)local_158,1);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    *iVar3._M_current = local_18c;
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,1);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    *iVar3._M_current = local_18c;
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    *iVar3._M_current = local_18c;
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current !=
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)__x);
                  this = (RhombicLattice *)local_188;
                  if (iVar1 == 0) {
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current !=
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)__x);
                    this = (RhombicLattice *)local_188;
                    if (iVar1 == 0) {
                      pvVar7 = local_178.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar5;
                      local_158._0_8_ = local_158 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar5 & 0xffffffff,(string *)local_158,1);
                      iVar3._M_current =
                           (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar3._M_current ==
                          (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (pvVar7,iVar3,&local_18c);
                      }
                      else {
                        *iVar3._M_current = local_18c;
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                      }
                      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                      }
                      pvVar7 = local_178.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar5;
                      local_158._0_8_ = local_158 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar5 & 0xffffffff,(string *)local_158,1);
                      iVar3._M_current =
                           (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar3._M_current ==
                          (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (pvVar7,iVar3,&local_18c);
                      }
                      else {
                        *iVar3._M_current = local_18c;
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                      }
                      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                      }
                      pvVar7 = local_178.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar5;
                      local_158._0_8_ = local_158 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff)
                      ;
                      iVar3._M_current =
                           (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar3._M_current ==
                          (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (pvVar7,iVar3,&local_18c);
                      }
                      else {
                        *iVar3._M_current = local_18c;
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                      }
                      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                      }
                      pvVar7 = local_178.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar5;
                      local_158._0_8_ = local_158 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff)
                      ;
                      iVar3._M_current =
                           (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar3._M_current !=
                          (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)__x);
                      if (iVar1 == 0) {
                        pvVar7 = local_178.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar5;
                        local_158._0_8_ = local_158 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_158,"xyz","");
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar5 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        iVar3._M_current =
                             (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar3._M_current ==
                            (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (pvVar7,iVar3,&local_18c);
                        }
                        else {
                          *iVar3._M_current = local_18c;
                          (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                        }
                        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                        }
                        pvVar7 = local_178.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar5;
                        local_158._0_8_ = local_158 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","")
                        ;
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar5 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        iVar3._M_current =
                             (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar3._M_current ==
                            (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (pvVar7,iVar3,&local_18c);
                        }
                        else {
                          *iVar3._M_current = local_18c;
                          (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                        }
                        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                        }
                        pvVar7 = local_178.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar5;
                        local_158._0_8_ = local_158 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","")
                        ;
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar5 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        iVar3._M_current =
                             (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar3._M_current ==
                            (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (pvVar7,iVar3,&local_18c);
                        }
                        else {
                          *iVar3._M_current = local_18c;
                          (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                        }
                        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                        }
                        pvVar7 = local_178.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar5;
                        local_158._0_8_ = local_158 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","")
                        ;
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar5 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        iVar3._M_current =
                             (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar3._M_current !=
                            (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (pvVar7,iVar3,&local_18c);
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)__x);
                        if (iVar1 == 0) {
                          pvVar7 = local_178.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar5;
                          local_158._0_8_ = local_158 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_158,"xy","");
                          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                (this,uVar5 & 0xffffffff,(string *)local_158,1);
                          iVar3._M_current =
                               (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (iVar3._M_current ==
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                      (pvVar7,iVar3,&local_18c);
                          }
                          else {
                            *iVar3._M_current = local_18c;
                            (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                          }
                          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                          }
                          pvVar7 = local_178.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar5;
                          local_158._0_8_ = local_158 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_158,"xz","");
                          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                (this,uVar5 & 0xffffffff,(string *)local_158,1);
                          iVar3._M_current =
                               (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (iVar3._M_current ==
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                      (pvVar7,iVar3,&local_18c);
                          }
                          else {
                            *iVar3._M_current = local_18c;
                            (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                          }
                          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                          }
                          pvVar7 = local_178.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar5;
                          local_158._0_8_ = local_158 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_158,"xyz","");
                          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                (this,uVar5 & 0xffffffff,(string *)local_158,
                                                 0xffffffff);
                          iVar3._M_current =
                               (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (iVar3._M_current ==
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                      (pvVar7,iVar3,&local_18c);
                          }
                          else {
                            *iVar3._M_current = local_18c;
                            (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                          }
                          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                          }
                          pvVar7 = local_178.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar5;
                          local_158._0_8_ = local_158 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_158,"yz","");
                          local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                (this,uVar5 & 0xffffffff,(string *)local_158,
                                                 0xffffffff);
                          iVar3._M_current =
                               (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (iVar3._M_current !=
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (pvVar7,iVar3,&local_18c);
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)__x);
                          if (iVar1 == 0) {
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"xy","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,1);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current ==
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (pvVar7,iVar3,&local_18c);
                            }
                            else {
                              *iVar3._M_current = local_18c;
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                            }
                            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                            }
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"yz","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,1);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current ==
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (pvVar7,iVar3,&local_18c);
                            }
                            else {
                              *iVar3._M_current = local_18c;
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                            }
                            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                            }
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"xyz","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,
                                                   0xffffffff);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current ==
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (pvVar7,iVar3,&local_18c);
                            }
                            else {
                              *iVar3._M_current = local_18c;
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                            }
                            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                            }
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"xz","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,
                                                   0xffffffff);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current !=
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                      (pvVar7,iVar3,&local_18c);
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)__x);
                            if (iVar1 != 0) goto LAB_0012cc1c;
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"xz","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,1);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current ==
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (pvVar7,iVar3,&local_18c);
                            }
                            else {
                              *iVar3._M_current = local_18c;
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                            }
                            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                            }
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"yz","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,1);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current ==
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (pvVar7,iVar3,&local_18c);
                            }
                            else {
                              *iVar3._M_current = local_18c;
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                            }
                            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                            }
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"xyz","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,
                                                   0xffffffff);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current ==
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (pvVar7,iVar3,&local_18c);
                            }
                            else {
                              *iVar3._M_current = local_18c;
                              (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                            }
                            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                            }
                            pvVar7 = local_178.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar5;
                            local_158._0_8_ = local_158 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_158,"xy","");
                            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                                  (this,uVar5 & 0xffffffff,(string *)local_158,
                                                   0xffffffff);
                            iVar3._M_current =
                                 (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (iVar3._M_current !=
                                (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                      (pvVar7,iVar3,&local_18c);
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_0012cc00:
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
            }
          }
          else if (uVar2 == 1) {
            iVar1 = std::__cxx11::string::compare((char *)__x);
            if (((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)__x), iVar1 != 0))
               && ((iVar1 = std::__cxx11::string::compare((char *)__x), iVar1 != 0 &&
                   (iVar1 = std::__cxx11::string::compare((char *)__x), iVar1 != 0)))) {
              iVar1 = std::__cxx11::string::compare((char *)__x);
              if (iVar1 == 0) {
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,1);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                }
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,1);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                }
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,1);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current !=
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (pvVar7,iVar3,&local_18c);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)__x);
                if (iVar1 == 0) {
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    *iVar3._M_current = local_18c;
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,1);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    *iVar3._M_current = local_18c;
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,1);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current !=
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)__x);
                  if (iVar1 == 0) {
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current !=
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)__x);
                    if (iVar1 != 0) goto LAB_0012cc1c;
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current !=
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                }
              }
              goto LAB_0012cc00;
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)__x);
            if ((((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)__x), iVar1 != 0))
                && (iVar1 = std::__cxx11::string::compare((char *)__x), iVar1 != 0)) &&
               (iVar1 = std::__cxx11::string::compare((char *)__x), iVar1 != 0)) {
              iVar1 = std::__cxx11::string::compare((char *)__x);
              if (iVar1 == 0) {
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                }
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  *iVar3._M_current = local_18c;
                  (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                }
                pvVar7 = local_178.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_158._0_8_ = local_158 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                iVar3._M_current =
                     (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current !=
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (pvVar7,iVar3,&local_18c);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)__x);
                if (iVar1 == 0) {
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,1);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    *iVar3._M_current = local_18c;
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    *iVar3._M_current = local_18c;
                    (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                  pvVar7 = local_178.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_158._0_8_ = local_158 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                  iVar3._M_current =
                       (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current !=
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (pvVar7,iVar3,&local_18c);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)__x);
                  if (iVar1 == 0) {
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"yz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current !=
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)__x);
                    if (iVar1 != 0) goto LAB_0012cc1c;
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,1);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xz","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current ==
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (pvVar7,iVar3,&local_18c);
                    }
                    else {
                      *iVar3._M_current = local_18c;
                      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                    pvVar7 = local_178.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    local_158._0_8_ = local_158 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xy","");
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar5 & 0xffffffff,(string *)local_158,0xffffffff);
                    iVar3._M_current =
                         (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar3._M_current !=
                        (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) goto LAB_0012cbf6;
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (pvVar7,iVar3,&local_18c);
                  }
                }
              }
              goto LAB_0012cc00;
            }
          }
LAB_0012cc1c:
          uVar5 = uVar5 + 1;
          iVar1 = (this->super_Lattice).l;
        } while ((long)uVar5 < (long)(iVar1 * iVar1 * iVar1 * 2));
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::
      pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                  *)local_158,__x,&local_178);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
                (local_58,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                           *)local_158);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_138);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_178);
      __x = __x + 1;
    } while (__x != local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void RhombicLattice::createUpEdgesMap()
{
    std::vector<std::string> directionList = {"xyz", "xy", "xz", "yz",
                                              "-xyz", "-xy", "-xz", "-yz"};
    for (const auto &direction : directionList)
    {
        vvint vertexToUpEdges;
        vertexToUpEdges.assign(2 * l * l * l, {});
        for (int vertexIndex = 0; vertexIndex < 2 * l * l * l; ++vertexIndex)
        {
            cartesian4 coordinate = indexToCoordinate(vertexIndex);
            if (coordinate.w == 0)
            {
                if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
                {
                    if (direction == "xyz")
                    {
                        // Third argument is sign
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                            // Edge includes vertex outside lattice
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "yz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "xz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "xy")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xyz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-yz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xy")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                }
            }
            else
            {
                if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
                {
                    if (direction == "xy" || direction == "xz" || direction == "yz" || direction == "-xyz")
                    {
                        // Only one up edge, so return an empty vector as no sweep will happen here.
                    }
                    else
                    {
                        if (direction == "xyz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-xy")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-xz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-yz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                    }
                }
                else
                {
                    if (direction == "-xy" || direction == "-xz" || direction == "-yz" || direction == "xyz")
                    {
                        // Only one up edge, so return an empty vector as no sweep will happen here.
                    }
                    else
                    {
                        if (direction == "-xyz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "xy")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "xz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "yz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                    }
                }
            }
        }
        upEdgesMap.insert(std::pair<std::string, vvint>(direction, vertexToUpEdges));
    }
}